

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

MetadataResult __thiscall
duckdb_shell::ShellState::DisplayEntries(ShellState *this,char **azArg,idx_t nArg,char type)

{
  ShellState *pSVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  MetadataResult MVar13;
  sqlite3_stmt *pStmt;
  string s;
  sqlite3_stmt *local_90;
  void *local_88;
  ShellState *local_80;
  uint local_78;
  uint local_74;
  long local_70;
  long local_68;
  char *local_60;
  undefined8 local_58;
  char local_50 [16];
  ulong local_40;
  ulong local_38;
  
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = '\0';
  OpenDB(this,0);
  MVar13 = PRINT_USAGE;
  if (2 < nArg) goto LAB_0020d71e;
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  local_80 = this;
  iVar2 = duckdb_shell_sqlite3_prepare_v2(this->db,local_60,-1,&local_90,(char **)0x0);
  MVar13 = FAIL;
  if (iVar2 != 0) goto LAB_0020d71e;
  if (nArg == 2) {
    duckdb_shell_sqlite3_bind_text(local_90,1,azArg[1],-1,(_func_void_void_ptr *)0xffffffffffffffff)
    ;
  }
  else {
    duckdb_shell_sqlite3_bind_text(local_90,1,"%",-1,(_func_void_void_ptr *)0x0);
  }
  iVar9 = 1;
  lVar8 = 0;
  iVar2 = 0;
  pvVar4 = (void *)0x0;
  while (iVar3 = duckdb_shell_sqlite3_step(local_90), iVar3 == 100) {
    if (iVar2 <= lVar8) {
      pvVar4 = duckdb_shell_sqlite3_realloc64(pvVar4,(long)(iVar2 * 2) * 8 + 0x50);
      if (pvVar4 == (void *)0x0) goto LAB_0020d744;
      iVar2 = iVar2 * 2 + 10;
    }
    duckdb_shell_sqlite3_column_text(local_90,0);
    pcVar5 = duckdb_shell_sqlite3_mprintf("%s");
    *(char **)((long)pvVar4 + lVar8 * 8) = pcVar5;
    if (pcVar5 == (char *)0x0) {
      DisplayEntries();
LAB_0020d744:
      DisplayEntries();
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      _Unwind_Resume(extraout_RAX);
    }
    lVar8 = lVar8 + 1;
    iVar9 = iVar9 + -1;
  }
  local_88 = pvVar4;
  iVar2 = duckdb_shell_sqlite3_finalize(local_90);
  pvVar4 = local_88;
  if (iVar2 == 0) {
    if (lVar8 != 0) {
      lVar12 = 0;
      uVar7 = 0;
      do {
        sVar6 = strlen(*(char **)((long)pvVar4 + lVar12 * 8));
        pSVar1 = local_80;
        uVar10 = sVar6 & 0xffffffff;
        if ((int)sVar6 < (int)uVar7) {
          uVar10 = uVar7;
        }
        lVar12 = lVar12 + 1;
        uVar7 = uVar10;
      } while (lVar8 != lVar12);
      uVar7 = 1;
      if ((uint)uVar10 < 0x4f) {
        uVar7 = 0x50 / (ulong)((uint)uVar10 + 2);
      }
      local_74 = (uint)uVar7;
      local_78 = local_74 - iVar9;
      iVar9 = (int)(local_78 / uVar7);
      local_40 = uVar10;
      if (0 < iVar9) {
        lVar12 = 0;
        local_68 = lVar8;
        do {
          pvVar4 = local_88;
          local_70 = lVar12;
          if ((uint)lVar12 < (uint)local_68) {
            local_38 = (ulong)local_78 / (ulong)local_74;
            do {
              pcVar5 = "  ";
              if ((int)lVar12 < iVar9) {
                pcVar5 = anon_var_dwarf_63f17de + 9;
              }
              pcVar11 = *(char **)((long)pvVar4 + lVar12 * 8);
              if (pcVar11 == (char *)0x0) {
                pcVar11 = anon_var_dwarf_63f17de + 9;
              }
              fprintf((FILE *)pSVar1->out,"%s%-*s",pcVar5,uVar10,pcVar11);
              lVar12 = lVar12 + local_38;
            } while ((int)lVar12 < (int)local_68);
          }
          fputc(10,(FILE *)pSVar1->out);
          lVar12 = local_70 + 1;
          lVar8 = local_68;
        } while ((int)lVar12 < iVar9);
      }
      goto LAB_0020d5c8;
    }
  }
  else {
    pcVar5 = duckdb_shell_sqlite3_errmsg(local_80->db);
    PrintDatabaseError(local_80,pcVar5);
LAB_0020d5c8:
    pvVar4 = local_88;
    if (lVar8 != 0) {
      lVar12 = 0;
      do {
        duckdb_shell_sqlite3_free(*(void **)((long)pvVar4 + lVar12 * 8));
        lVar12 = lVar12 + 1;
      } while (lVar8 != lVar12);
    }
  }
  duckdb_shell_sqlite3_free(pvVar4);
  MVar13 = iVar2 != 0;
LAB_0020d71e:
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return MVar13;
}

Assistant:

MetadataResult ShellState::DisplayEntries(const char **azArg, idx_t nArg, char type) {
	sqlite3_stmt *pStmt;
	char **azResult;
	int nRow, nAlloc;
	int ii;
	string s;
	OpenDB(0);
	//    rc = sqlite3_prepare_v2(db, "PRAGMA database_list", -1, &pStmt, 0);
	//    if( rc ){
	//      sqlite3_finalize(pStmt);
	//      return shellDatabaseError(db);
	//    }

	if (nArg > 2) {
		return MetadataResult::PRINT_USAGE;
	}
	//    for(ii=0; sqlite3_step(pStmt)==SQLITE_ROW; ii++){
	//      const char *zDbName = (const char*)sqlite3_column_text(pStmt, 1);
	//      if( zDbName==0 ) continue;
	//      if( s.z && s.z[0] ) appendText(&s, " UNION ALL ", 0);
	appendText(s, "SELECT name FROM ", 0);
	//      appendText(&s, zDbName, '"');
	appendText(s, "sqlite_schema ", 0);
	if (type == 't') {
		appendText(s,
		           " WHERE type IN ('table','view')"
		           "   AND name NOT LIKE 'sqlite_%'"
		           "   AND name LIKE ?1",
		           0);
	} else {
		appendText(s,
		           " WHERE type='index'"
		           "   AND tbl_name LIKE ?1",
		           0);
	}
	//    }
	//    rc = sqlite3_finalize(pStmt);
	appendText(s, " ORDER BY 1", 0);
	int rc = sqlite3_prepare_v2(db, s.c_str(), -1, &pStmt, 0);
	if (rc) {
		return MetadataResult::FAIL;
	}

	/* Run the SQL statement prepared by the above block. Store the results
	** as an array of nul-terminated strings in azResult[].  */
	nRow = nAlloc = 0;
	azResult = nullptr;
	if (nArg > 1) {
		sqlite3_bind_text(pStmt, 1, azArg[1], -1, SQLITE_TRANSIENT);
	} else {
		sqlite3_bind_text(pStmt, 1, "%", -1, SQLITE_STATIC);
	}
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		if (nRow >= nAlloc) {
			char **azNew;
			int n2 = nAlloc * 2 + 10;
			azNew = (char **)sqlite3_realloc64(azResult, sizeof(azResult[0]) * n2);
			if (azNew == 0)
				shell_out_of_memory();
			nAlloc = n2;
			azResult = azNew;
		}
		azResult[nRow] = sqlite3_mprintf("%s", sqlite3_column_text(pStmt, 0));
		if (0 == azResult[nRow])
			shell_out_of_memory();
		nRow++;
	}
	if (sqlite3_finalize(pStmt) != SQLITE_OK) {
		rc = ShellDatabaseError(db);
	}

	/* Pretty-print the contents of array azResult[] to the output */
	if (rc == 0 && nRow > 0) {
		int len, maxlen = 0;
		int i, j;
		int nPrintCol, nPrintRow;
		for (i = 0; i < nRow; i++) {
			len = StringLength(azResult[i]);
			if (len > maxlen)
				maxlen = len;
		}
		nPrintCol = 80 / (maxlen + 2);
		if (nPrintCol < 1)
			nPrintCol = 1;
		nPrintRow = (nRow + nPrintCol - 1) / nPrintCol;
		for (i = 0; i < nPrintRow; i++) {
			for (j = i; j < nRow; j += nPrintRow) {
				const char *zSp = j < nPrintRow ? "" : "  ";
				utf8_printf(out, "%s%-*s", zSp, maxlen, azResult[j] ? azResult[j] : "");
			}
			raw_printf(out, "\n");
		}
	}

	for (ii = 0; ii < nRow; ii++) {
		sqlite3_free(azResult[ii]);
	}
	sqlite3_free(azResult);
	return rc == 0 ? MetadataResult::SUCCESS : MetadataResult::FAIL;
}